

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::inherit_expression_dependencies
          (Compiler *this,uint32_t dst,uint32_t source_expression)

{
  iterator iVar1;
  SPIRExpression *pSVar2;
  SPIRVariable *pSVar3;
  SPIRExpression *pSVar4;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this_00;
  uint32_t local_2c;
  TypedID<(spirv_cross::Types)0> local_28;
  TypedID<(spirv_cross::Types)0> local_24;
  
  local_2c = dst;
  iVar1 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->forwarded_temporaries)._M_h,&local_2c);
  if (iVar1.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    iVar1 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->forced_temporaries)._M_h,&local_2c);
    if (iVar1.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      pSVar2 = get<spirv_cross::SPIRExpression>(this,local_2c);
      pSVar3 = maybe_get<spirv_cross::SPIRVariable>(this,source_expression);
      if ((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->phi_variable == true)) {
        local_24.id = local_2c;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                  (&pSVar3->dependees,&local_24);
      }
      pSVar4 = maybe_get<spirv_cross::SPIRExpression>(this,source_expression);
      if (pSVar4 != (SPIRExpression *)0x0) {
        this_00 = &pSVar2->expression_dependencies;
        local_28.id = source_expression;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back(this_00,&local_28);
        pTVar5 = (pSVar4->expression_dependencies).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::insert
                  (this_00,(pSVar2->expression_dependencies).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                           (pSVar2->expression_dependencies).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                           buffer_size,pTVar5,
                   pTVar5 + (pSVar4->expression_dependencies).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                            buffer_size);
        pTVar5 = (pSVar2->expression_dependencies).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        ::std::
        __sort<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar5,pTVar5 + (pSVar2->expression_dependencies).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                                   buffer_size);
        pTVar5 = (pSVar2->expression_dependencies).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        pTVar5 = ::std::
                 __unique<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (pTVar5,pTVar5 + (pSVar2->expression_dependencies).
                                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                            .buffer_size);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::erase
                  (this_00,pTVar5,
                   (pSVar2->expression_dependencies).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                   (pSVar2->expression_dependencies).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size);
      }
    }
  }
  return;
}

Assistant:

void Compiler::inherit_expression_dependencies(uint32_t dst, uint32_t source_expression)
{
	// Don't inherit any expression dependencies if the expression in dst
	// is not a forwarded temporary.
	if (forwarded_temporaries.find(dst) == end(forwarded_temporaries) ||
	    forced_temporaries.find(dst) != end(forced_temporaries))
	{
		return;
	}

	auto &e = get<SPIRExpression>(dst);
	auto *phi = maybe_get<SPIRVariable>(source_expression);
	if (phi && phi->phi_variable)
	{
		// We have used a phi variable, which can change at the end of the block,
		// so make sure we take a dependency on this phi variable.
		phi->dependees.push_back(dst);
	}

	auto *s = maybe_get<SPIRExpression>(source_expression);
	if (!s)
		return;

	auto &e_deps = e.expression_dependencies;
	auto &s_deps = s->expression_dependencies;

	// If we depend on a expression, we also depend on all sub-dependencies from source.
	e_deps.push_back(source_expression);
	e_deps.insert(end(e_deps), begin(s_deps), end(s_deps));

	// Eliminate duplicated dependencies.
	sort(begin(e_deps), end(e_deps));
	e_deps.erase(unique(begin(e_deps), end(e_deps)), end(e_deps));
}